

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

int greatest_memory_equal_cb(void *exp,void *got,void *udata)

{
  int iVar1;
  
  iVar1 = bcmp(exp,got,*(size_t *)((long)udata + 0x10));
  return (int)(iVar1 == 0);
}

Assistant:

int
main(int argc, char ** argv) {
    srandom(time(NULL));
    GREATEST_MAIN_BEGIN();
    RUN_SUITE(generic_pack_unpack_le);
    RUN_SUITE(generic_pack_unpack_be);
    RUN_SUITE(generic_mixed_endian);
    RUN_SUITE(plan);
    GREATEST_MAIN_END();
}